

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O1

REF_STATUS ref_egads_extract_fun3d_mapbc(REF_GEOM ref_geom,char *mapbc,REF_BOOL axi)

{
  FILE *__stream;
  undefined8 uVar1;
  char *pcVar2;
  
  __stream = fopen(mapbc,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",mapbc);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",0x1158,
           "ref_egads_extract_fun3d_mapbc","unable to open file");
    return 2;
  }
  if (ref_geom->manifold == 0) {
    if (ref_geom->nedge < 1) {
      fprintf(__stream,"%d\n",(ulong)(ref_geom->nedge + 2));
      if (ref_geom->nedge < 1) {
        fprintf(__stream,"%d %s\n",(ulong)(ref_geom->nedge + 1),"6662 symmetry-y-min");
        pcVar2 = "6022 symmetry-y-max-axi";
        if (axi == 0) {
          pcVar2 = "6662 symmetry-y-max";
        }
        fprintf(__stream,"%d %s\n",(ulong)(ref_geom->nedge + 2),pcVar2);
        goto LAB_002245a4;
      }
      printf("no-op, EGADS not linked with HAVE_EGADS_EFFECTIVE %s\n","ref_egads_get_attribute");
      uVar1 = 0x118b;
      goto LAB_00224550;
    }
    printf("no-op, EGADS not linked with HAVE_EGADS_EFFECTIVE %s\n","ref_egads_get_attribute");
    pcVar2 = "bc_name not set for edge %d\n";
  }
  else {
    if (ref_geom->nface < 1) {
      fprintf(__stream,"%d\n");
      if (ref_geom->nface < 1) {
LAB_002245a4:
        fclose(__stream);
        return 0;
      }
      printf("no-op, EGADS not linked with HAVE_EGADS_EFFECTIVE %s\n","ref_egads_get_attribute");
      uVar1 = 0x116b;
LAB_00224550:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",uVar1
             ,"ref_egads_extract_fun3d_mapbc",5,"get");
      return 5;
    }
    printf("no-op, EGADS not linked with HAVE_EGADS_EFFECTIVE %s\n","ref_egads_get_attribute");
    pcVar2 = "bc_name not set for face %d\n";
  }
  printf(pcVar2,1);
  return 5;
}

Assistant:

REF_FCN REF_STATUS ref_egads_extract_fun3d_mapbc(REF_GEOM ref_geom,
                                                 const char *mapbc,
                                                 REF_BOOL axi) {
  FILE *file;
  file = fopen(mapbc, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", mapbc);
  RNS(file, "unable to open file");

  if (ref_geom->manifold) {
    REF_INT face_id;
    const char *attribute = NULL;
    for (face_id = 1; face_id <= ref_geom->nface; face_id++) {
      if (REF_SUCCESS != ref_egads_get_attribute(ref_geom, REF_GEOM_FACE,
                                                 face_id, "bc_name",
                                                 &attribute)) {
        printf("bc_name not set for face %d\n", face_id);
        return REF_NOT_FOUND;
      }
    }
    fprintf(file, "%d\n", ref_geom->nface);
    for (face_id = 1; face_id <= ref_geom->nface; face_id++) {
      char *bc_name;
      REF_SIZE len, i;
      RSS(ref_egads_get_attribute(ref_geom, REF_GEOM_FACE, face_id, "bc_name",
                                  &attribute),
          "get");
      RNS(attribute, "attribute NULL");
      len = strlen(attribute);
      RAS(10000 > len, "attribute more than 10000 bytes");
      ref_malloc(bc_name, (REF_LONG)(len + 1), char);
      strcpy(bc_name, attribute);
      for (i = 0; i < len; i++) {
        if ('_' == bc_name[i]) {
          bc_name[i] = ' ';
          break;
        }
      }
      fprintf(file, "%d %s\n", face_id, bc_name);
      ref_free(bc_name);
    }
  } else {
    REF_INT edge_id;
    const char *attribute = NULL;
    for (edge_id = 1; edge_id <= ref_geom->nedge; edge_id++) {
      if (REF_SUCCESS != ref_egads_get_attribute(ref_geom, REF_GEOM_EDGE,
                                                 edge_id, "bc_name",
                                                 &attribute)) {
        printf("bc_name not set for edge %d\n", edge_id);
        return REF_NOT_FOUND;
      }
    }
    fprintf(file, "%d\n", 2 + ref_geom->nedge);
    for (edge_id = 1; edge_id <= ref_geom->nedge; edge_id++) {
      char *bc_name;
      REF_SIZE len, i;
      RSS(ref_egads_get_attribute(ref_geom, REF_GEOM_EDGE, edge_id, "bc_name",
                                  &attribute),
          "get");
      RNS(attribute, "attribute NULL");
      len = strlen(attribute);
      RAS(10000 > len, "attribute more than 10000 bytes");
      ref_malloc(bc_name, (REF_LONG)(len + 1), char);
      strcpy(bc_name, attribute);
      for (i = 0; i < len; i++) {
        if ('_' == bc_name[i]) {
          bc_name[i] = ' ';
          break;
        }
      }
      fprintf(file, "%d %s\n", edge_id, bc_name);
      ref_free(bc_name);
    }
    edge_id = ref_geom->nedge + 1;
    fprintf(file, "%d %s\n", edge_id, "6662 symmetry-y-min");
    edge_id = ref_geom->nedge + 2;
    if (axi) {
      fprintf(file, "%d %s\n", edge_id, "6022 symmetry-y-max-axi");
    } else {
      fprintf(file, "%d %s\n", edge_id, "6662 symmetry-y-max");
    }
  }
  fclose(file);

  return REF_SUCCESS;
}